

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject.cpp
# Opt level: O3

string * __thiscall
bidfx_public_api::price::subject::Subject::GetComponent
          (string *__return_storage_ptr__,Subject *this,string *key)

{
  pointer pbVar1;
  _Alloc_hider _Var2;
  uint uVar3;
  
  uVar3 = SubjectUtils::BinarySearch(&this->components_,key);
  if ((int)uVar3 < 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    pbVar1 = (this->components_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    _Var2._M_p = pbVar1[(ulong)uVar3 + 1]._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,_Var2._M_p,
               _Var2._M_p + pbVar1[(ulong)uVar3 + 1]._M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Subject::GetComponent(std::string key) const
{
    int index = SubjectUtils::BinarySearch(&components_, key);

    if (index >= 0)
    {
        return components_[index + 1];
    }

    return "";
}